

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_command.cpp
# Opt level: O2

UniValue *
RunCommandParseJSON(UniValue *__return_storage_ptr__,string *str_command,string *str_std_in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  string str;
  pair<int,_int> pVar3;
  ssize_t sVar4;
  runtime_error *prVar5;
  string *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nbytes;
  void *__buf;
  error *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  undefined4 uStack_528;
  int n_error;
  undefined1 local_520 [32];
  pointer local_500;
  pointer local_4f8;
  string local_4e0;
  string error;
  string result;
  Popen c;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398 [16];
  istringstream stderr_stream;
  string local_378 [368];
  istringstream stdout_stream;
  string local_1f8 [368];
  UniValue result_json;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  result_json.val._M_dataplus._M_p = (pointer)&result_json.val.field_2;
  result_json.val._M_string_length = 0;
  result_json.val.field_2._M_local_buf[0] = '\0';
  result_json.typ = VNULL;
  result_json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result_json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result_json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result_json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result_json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&stdout_stream);
  std::__cxx11::istringstream::istringstream((istringstream *)&stderr_stream);
  if (str_command->_M_string_length == 0) {
    local_3a8 = local_398;
    local_3a0 = 0;
    local_398[0] = 0;
    str._M_dataplus._M_p._4_4_ = n_error;
    str._M_dataplus._M_p._0_4_ = uStack_528;
    str._M_string_length._0_4_ = local_520._0_4_;
    str._M_string_length._4_4_ = local_520._4_4_;
    str.field_2._M_allocated_capacity._0_4_ = local_520._8_4_;
    str.field_2._M_allocated_capacity._4_4_ = local_520._12_4_;
    str.field_2._8_8_ = local_520._16_8_;
    UniValue::UniValue(__return_storage_ptr__,VNULL,str);
    std::__cxx11::string::~string((string *)&local_3a8);
  }
  else {
    result._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    result._M_dataplus._M_p = (pointer)subprocess::util::pipe_cloexec();
    error._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    error._M_dataplus._M_p = (pointer)subprocess::util::pipe_cloexec();
    local_520._0_4_ = local_520._0_4_ & 0xffffff00;
    local_520._4_4_ = -1;
    local_520._8_4_ = -1;
    pVar3 = subprocess::util::pipe_cloexec();
    args_2 = (error *)local_520;
    local_520._4_4_ = pVar3.first;
    local_520._8_4_ = pVar3.second;
    args_1 = &error;
    subprocess::Popen::Popen<subprocess::input,subprocess::output,subprocess::error>
              (&c,str_command,(input *)&result,(output *)args_1,args_2);
    if (str_std_in->_M_string_length != 0) {
      subprocess::Popen::send(&c,(int)str_std_in,__buf,(size_t)args_1,(int)args_2);
    }
    subprocess::Popen::communicate((pair<subprocess::Buffer,_subprocess::Buffer> *)local_520,&c);
    paVar1 = &result.field_2;
    result._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&result,CONCAT44(local_520._4_4_,local_520._0_4_),
               CONCAT44(local_520._12_4_,local_520._8_4_));
    std::__cxx11::stringbuf::str(local_1f8);
    std::__cxx11::string::~string((string *)&result);
    result._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&result,local_500,local_4f8);
    std::__cxx11::stringbuf::str(local_378);
    std::__cxx11::string::~string((string *)&result);
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    __nbytes = &error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    error._M_dataplus._M_p = (pointer)__nbytes;
    result._M_dataplus._M_p = (pointer)paVar1;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&stdout_stream,(string *)&result);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&stderr_stream,(string *)&error);
    n_error = c.retcode_;
    if (c.retcode_ != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
                (&local_4e0,(tinyformat *)"RunCommandParseJSON error: process(%s) returned %d: %s\n"
                 ,(char *)str_command,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_error,
                 (int *)&error,in_R9);
      std::runtime_error::runtime_error(prVar5,(string *)&local_4e0);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00364eaf;
    }
    sVar4 = UniValue::read(&result_json,(int)result._M_string_length,result._M_dataplus._M_p,
                           (size_t)__nbytes);
    if ((char)sVar4 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_4e0,"Unable to parse JSON: ",&result);
      std::runtime_error::runtime_error(prVar5,(string *)&local_4e0);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00364eaf;
    }
    UniValue::UniValue(__return_storage_ptr__,&result_json);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&result);
    std::pair<subprocess::Buffer,_subprocess::Buffer>::~pair
              ((pair<subprocess::Buffer,_subprocess::Buffer> *)local_520);
    subprocess::Popen::~Popen(&c);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&stderr_stream);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stdout_stream);
  UniValue::~UniValue(&result_json);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
LAB_00364eaf:
  __stack_chk_fail();
}

Assistant:

UniValue RunCommandParseJSON(const std::string& str_command, const std::string& str_std_in)
{
#ifdef ENABLE_EXTERNAL_SIGNER
    namespace sp = subprocess;

    UniValue result_json;
    std::istringstream stdout_stream;
    std::istringstream stderr_stream;

    if (str_command.empty()) return UniValue::VNULL;

    auto c = sp::Popen(str_command, sp::input{sp::PIPE}, sp::output{sp::PIPE}, sp::error{sp::PIPE});
    if (!str_std_in.empty()) {
        c.send(str_std_in);
    }
    auto [out_res, err_res] = c.communicate();
    stdout_stream.str(std::string{out_res.buf.begin(), out_res.buf.end()});
    stderr_stream.str(std::string{err_res.buf.begin(), err_res.buf.end()});

    std::string result;
    std::string error;
    std::getline(stdout_stream, result);
    std::getline(stderr_stream, error);

    const int n_error = c.retcode();
    if (n_error) throw std::runtime_error(strprintf("RunCommandParseJSON error: process(%s) returned %d: %s\n", str_command, n_error, error));
    if (!result_json.read(result)) throw std::runtime_error("Unable to parse JSON: " + result);

    return result_json;
#else
    throw std::runtime_error("Compiled without external signing support (required for external signing).");
#endif // ENABLE_EXTERNAL_SIGNER
}